

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::SimpleDateFormat::compareSimpleAffix
          (SimpleDateFormat *this,UnicodeString *affix,UnicodeString *input,int32_t pos)

{
  short sVar1;
  UBool UVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int32_t offset;
  int iVar6;
  SimpleDateFormat *this_00;
  int32_t iVar7;
  int iVar8;
  bool bVar9;
  
  sVar1 = (affix->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar8 = (affix->fUnion).fFields.fLength;
  }
  else {
    iVar8 = (int)sVar1 >> 5;
  }
  offset = pos;
  if (0 < iVar8) {
    iVar7 = 0;
    do {
      uVar3 = icu_63::UnicodeString::char32At(affix,iVar7);
      iVar8 = 2 - (uint)(uVar3 < 0x10000);
      this_00 = (SimpleDateFormat *)(ulong)uVar3;
      UVar2 = PatternProps::isWhiteSpace(uVar3);
      sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      if (UVar2 == '\0') {
        if (iVar5 <= offset) {
          return -1;
        }
        uVar4 = icu_63::UnicodeString::char32At(input,offset);
        if (uVar4 != uVar3) {
          return -1;
        }
        iVar7 = iVar7 + iVar8;
        offset = offset + iVar8;
      }
      else {
        iVar6 = offset;
        if (offset < iVar5) {
          this_00 = (SimpleDateFormat *)input;
          uVar4 = icu_63::UnicodeString::char32At(input,offset);
          bVar9 = uVar4 == uVar3;
          if (bVar9) {
            do {
              sVar1 = (affix->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar5 = (affix->fUnion).fFields.fLength;
              }
              else {
                iVar5 = (int)sVar1 >> 5;
              }
              iVar7 = iVar7 + iVar8;
              iVar6 = iVar6 + iVar8;
              if (iVar7 == iVar5) break;
              uVar3 = icu_63::UnicodeString::char32At(affix,iVar7);
              this_00 = (SimpleDateFormat *)(ulong)uVar3;
              UVar2 = PatternProps::isWhiteSpace(uVar3);
              if (UVar2 == '\0') break;
              sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar8 = (input->fUnion).fFields.fLength;
              }
              else {
                iVar8 = (int)sVar1 >> 5;
              }
              if (iVar8 <= iVar6) break;
              iVar8 = 2 - (uint)(uVar3 < 0x10000);
              this_00 = (SimpleDateFormat *)input;
              uVar4 = icu_63::UnicodeString::char32At(input,iVar6);
            } while (uVar4 == uVar3);
          }
        }
        else {
          bVar9 = false;
        }
        iVar7 = skipPatternWhiteSpace(this_00,affix,iVar7);
        offset = skipUWhiteSpace(this_00,input,iVar6);
        if ((!bVar9) && (offset == iVar6)) {
          return -1;
        }
        iVar7 = skipUWhiteSpace(this_00,affix,iVar7);
      }
      sVar1 = (affix->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (affix->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
    } while (iVar7 < iVar8);
  }
  return offset - pos;
}

Assistant:

int32_t
SimpleDateFormat::compareSimpleAffix(const UnicodeString& affix,
                   const UnicodeString& input,
                   int32_t pos) const {
    int32_t start = pos;
    for (int32_t i=0; i<affix.length(); ) {
        UChar32 c = affix.char32At(i);
        int32_t len = U16_LENGTH(c);
        if (PatternProps::isWhiteSpace(c)) {
            // We may have a pattern like: \u200F \u0020
            //        and input text like: \u200F \u0020
            // Note that U+200F and U+0020 are Pattern_White_Space but only
            // U+0020 is UWhiteSpace.  So we have to first do a direct
            // match of the run of Pattern_White_Space in the pattern,
            // then match any extra characters.
            UBool literalMatch = FALSE;
            while (pos < input.length() &&
                   input.char32At(pos) == c) {
                literalMatch = TRUE;
                i += len;
                pos += len;
                if (i == affix.length()) {
                    break;
                }
                c = affix.char32At(i);
                len = U16_LENGTH(c);
                if (!PatternProps::isWhiteSpace(c)) {
                    break;
                }
            }

            // Advance over run in pattern
            i = skipPatternWhiteSpace(affix, i);

            // Advance over run in input text
            // Must see at least one white space char in input,
            // unless we've already matched some characters literally.
            int32_t s = pos;
            pos = skipUWhiteSpace(input, pos);
            if (pos == s && !literalMatch) {
                return -1;
            }

            // If we skip UWhiteSpace in the input text, we need to skip it in the pattern.
            // Otherwise, the previous lines may have skipped over text (such as U+00A0) that
            // is also in the affix.
            i = skipUWhiteSpace(affix, i);
        } else {
            if (pos < input.length() &&
                input.char32At(pos) == c) {
                i += len;
                pos += len;
            } else {
                return -1;
            }
        }
    }
    return pos - start;
}